

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void delay(uint ms)

{
  uint in_EDI;
  
  sleep(in_EDI / 1000);
  usleep((in_EDI % 1000) * 1000);
  return;
}

Assistant:

void delay(unsigned int ms)
{
#if defined(_WIN32)
  Sleep(ms);
#else
  sleep(ms / 1000);
  usleep(ms % 1000 * 1000);
#endif
}